

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageadapter.h
# Opt level: O0

void __thiscall
bgui::ImageAdapter<unsigned_short>::setSmoothing(ImageAdapter<unsigned_short> *this,bool tf)

{
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *this_00;
  size_type sVar1;
  vector<gimage::Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>,_std::allocator<gimage::Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>_>_>
  *this_01;
  reference this_02;
  byte in_SIL;
  long in_RDI;
  long h;
  long w;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *p;
  int in_stack_000000f4;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *in_stack_000000f8;
  value_type *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 uVar2;
  long local_28;
  long local_20;
  
  if (((in_SIL & 1) == 0) ||
     (sVar1 = std::
              vector<gimage::Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>,_std::allocator<gimage::Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>_>_>
              ::size((vector<gimage::Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>,_std::allocator<gimage::Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>_>_>
                      *)(in_RDI + 0x90)), sVar1 != 0)) {
    if ((in_SIL & 1) == 0) {
      std::
      vector<gimage::Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>,_std::allocator<gimage::Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>_>_>
      ::clear((vector<gimage::Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>,_std::allocator<gimage::Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>_>_>
               *)0x14974e);
    }
  }
  else {
    this_00 = *(Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> **)(in_RDI + 0x70);
    local_20 = gimage::Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getWidth
                         (this_00);
    local_28 = gimage::Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getHeight
                         (this_00);
    while (uVar2 = 0x40 < local_20 && 0x40 < local_28, 0x40 < local_20 && 0x40 < local_28) {
      this_01 = (vector<gimage::Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>,_std::allocator<gimage::Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>_>_>
                 *)(in_RDI + 0x90);
      gimage::downscaleImage<unsigned_short>(in_stack_000000f8,in_stack_000000f4);
      std::
      vector<gimage::Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>,_std::allocator<gimage::Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>_>_>
      ::push_back(this_01,in_stack_ffffffffffffff68);
      gimage::Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::~Image
                ((Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *)
                 CONCAT17(uVar2,in_stack_ffffffffffffff80));
      this_02 = std::
                vector<gimage::Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>,_std::allocator<gimage::Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>_>_>
                ::back(this_01);
      local_20 = gimage::Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getWidth
                           (this_02);
      local_28 = gimage::Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getHeight
                           (this_02);
    }
  }
  return;
}

Assistant:

void setSmoothing(bool tf)
    {
      if (tf && mipmap.size() == 0)
      {
        const gimage::Image<T> *p=image;
        long w=p->getWidth();
        long h=p->getHeight();

        while (w > 64 && h > 64)
        {
          mipmap.push_back(downscaleImage(*p, 2));

          p=&mipmap.back();
          w=p->getWidth();
          h=p->getHeight();
        }
      }
      else if (!tf)
      {
        mipmap.clear();
      }
    }